

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O2

MaterialHandle __thiscall
pbrt::MaterialHandle::Create
          (MaterialHandle *this,string *name,TextureParameterDictionary *parameters,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>_>
          *namedMaterials,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  uintptr_t iptr;
  SubsurfaceMaterial *pSVar2;
  CoatedDiffuseMaterial *pCVar3;
  CoatedConductorMaterial *pCVar4;
  DielectricMaterial *pDVar5;
  MeasuredMaterial *pMVar6;
  iterator iVar7;
  long lVar8;
  MixMaterial *pMVar9;
  FileLoc *pFVar10;
  char *pcVar11;
  ulong uVar12;
  uintptr_t uVar13;
  long in_FS_OFFSET;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  materials;
  MaterialHandle materialHandles [2];
  allocator<char> local_89;
  long local_88;
  string *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  _Base_ptr local_60;
  string local_58;
  
  if ((name->_M_string_length == 0) || (bVar1 = std::operator==(name,"none"), bVar1)) {
    uVar13 = 0;
    goto LAB_003b2598;
  }
  pFVar10 = (FileLoc *)0x48f174;
  bVar1 = std::operator==(name,"diffuse");
  if (bVar1) {
    pSVar2 = (SubsurfaceMaterial *)DiffuseMaterial::Create(parameters,pFVar10,alloc);
    uVar12 = 0x5000000000000;
    goto LAB_003b2540;
  }
  pcVar11 = "coateddiffuse";
  bVar1 = std::operator==(name,"coateddiffuse");
  if (bVar1) {
    pCVar3 = CoatedDiffuseMaterial::Create(parameters,(FileLoc *)pcVar11,alloc);
    uVar13 = (ulong)pCVar3 | 0x1000000000000;
  }
  else {
    pcVar11 = "coatedconductor";
    bVar1 = std::operator==(name,"coatedconductor");
    if (bVar1) {
      pCVar4 = CoatedConductorMaterial::Create(parameters,(FileLoc *)pcVar11,alloc);
      uVar13 = (ulong)pCVar4 | 0x2000000000000;
    }
    else {
      pcVar11 = "diffusetransmission";
      bVar1 = std::operator==(name,"diffusetransmission");
      if (bVar1) {
        pSVar2 = (SubsurfaceMaterial *)
                 DiffuseTransmissionMaterial::Create(parameters,(FileLoc *)pcVar11,alloc);
        uVar12 = 0x6000000000000;
      }
      else {
        bVar1 = std::operator==(name,"dielectric");
        if (bVar1) {
          pDVar5 = DielectricMaterial::Create(parameters,loc,alloc);
          uVar13 = (ulong)pDVar5 | 0x4000000000000;
          goto LAB_003b257e;
        }
        bVar1 = std::operator==(name,"thindielectric");
        if (bVar1) {
          pSVar2 = (SubsurfaceMaterial *)ThinDielectricMaterial::Create(parameters,loc,alloc);
          uVar12 = 0xa000000000000;
        }
        else {
          bVar1 = std::operator==(name,"hair");
          if (bVar1) {
            pSVar2 = (SubsurfaceMaterial *)HairMaterial::Create(parameters,loc,alloc);
            uVar12 = 0x7000000000000;
          }
          else {
            pFVar10 = (FileLoc *)0x28b0014;
            bVar1 = std::operator==(name,"conductor");
            if (!bVar1) {
              pcVar11 = "measured";
              bVar1 = std::operator==(name,"measured");
              if (bVar1) {
                pMVar6 = MeasuredMaterial::Create(parameters,(FileLoc *)pcVar11,alloc);
                uVar13 = (ulong)pMVar6 | 0x8000000000000;
              }
              else {
                bVar1 = std::operator==(name,"subsurface");
                if (bVar1) {
                  pSVar2 = SubsurfaceMaterial::Create(parameters,loc,alloc);
                  uVar12 = 0x9000000000000;
                  goto LAB_003b2540;
                }
                bVar1 = std::operator==(name,"mix");
                if (!bVar1) {
                  pcVar11 = "%s: material type unknown.";
                  goto LAB_003b280d;
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_58,"materials",&local_89);
                TextureParameterDictionary::GetStringArray(&local_78,parameters,&local_58);
                local_80 = &local_58;
                std::__cxx11::string::~string((string *)local_80);
                if ((long)local_78.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_78.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start != 0x40) {
                  ErrorExit<>("Must provide two values for \"string materials\" for mix material.");
                }
                local_60 = &(namedMaterials->_M_t)._M_impl.super__Rb_tree_header._M_header;
                local_58._M_dataplus._M_p = (pointer)0x0;
                local_58._M_string_length = 0;
                lVar8 = 0;
                while (lVar8 != 0x40) {
                  local_88 = lVar8;
                  iVar7 = std::
                          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>_>
                          ::find(&namedMaterials->_M_t,
                                 (key_type *)
                                 ((long)&((local_78.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar8));
                  if (iVar7._M_node == local_60) {
                    ErrorExit<std::__cxx11::string&>
                              ("%s: named material not found.",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&((local_78.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + local_88));
                  }
                  (local_80->_M_dataplus)._M_p = *(pointer *)(iVar7._M_node + 2);
                  local_80 = (string *)&local_80->_M_string_length;
                  lVar8 = local_88 + 0x20;
                }
                pMVar9 = MixMaterial::Create((MaterialHandle *)&local_58,parameters,loc,alloc);
                uVar13 = (ulong)pMVar9 | 0xb000000000000;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_78);
              }
              goto LAB_003b257e;
            }
            pSVar2 = (SubsurfaceMaterial *)ConductorMaterial::Create(parameters,pFVar10,alloc);
            uVar12 = 0x3000000000000;
          }
        }
      }
LAB_003b2540:
      uVar13 = uVar12 | (ulong)pSVar2;
    }
  }
LAB_003b257e:
  if ((uVar13 & 0xffffffffffff) == 0) {
    pcVar11 = "%s: unable to create material.";
LAB_003b280d:
    ErrorExit<std::__cxx11::string_const&>(loc,pcVar11,name);
  }
  TextureParameterDictionary::ReportUnused(parameters);
  *(long *)(in_FS_OFFSET + -0x368) = *(long *)(in_FS_OFFSET + -0x368) + 1;
LAB_003b2598:
  (this->
  super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
  ).bits = uVar13;
  return (MaterialHandle)
         (TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
          )this;
}

Assistant:

MaterialHandle MaterialHandle::Create(
    const std::string &name, const TextureParameterDictionary &parameters,
    /*const */ std::map<std::string, MaterialHandle> &namedMaterials, const FileLoc *loc,
    Allocator alloc) {
    MaterialHandle material;
    if (name.empty() || name == "none")
        return nullptr;
    else if (name == "diffuse")
        material = DiffuseMaterial::Create(parameters, loc, alloc);
    else if (name == "coateddiffuse")
        material = CoatedDiffuseMaterial::Create(parameters, loc, alloc);
    else if (name == "coatedconductor")
        material = CoatedConductorMaterial::Create(parameters, loc, alloc);
    else if (name == "diffusetransmission")
        material = DiffuseTransmissionMaterial::Create(parameters, loc, alloc);
    else if (name == "dielectric")
        material = DielectricMaterial::Create(parameters, loc, alloc);
    else if (name == "thindielectric")
        material = ThinDielectricMaterial::Create(parameters, loc, alloc);
    else if (name == "hair")
        material = HairMaterial::Create(parameters, loc, alloc);
    else if (name == "conductor")
        material = ConductorMaterial::Create(parameters, loc, alloc);
    else if (name == "measured")
        material = MeasuredMaterial::Create(parameters, loc, alloc);
    else if (name == "subsurface")
        material = SubsurfaceMaterial::Create(parameters, loc, alloc);
    else if (name == "mix") {
        std::vector<std::string> materials = parameters.GetStringArray("materials");
        if (materials.size() != 2)
            ErrorExit(
                "Must provide two values for \"string materials\" for mix material.");

        MaterialHandle materialHandles[2];
        for (int i = 0; i < 2; ++i) {
            auto iter = namedMaterials.find(materials[i]);
            if (iter == namedMaterials.end())
                ErrorExit("%s: named material not found.", materials[i]);
            materialHandles[i] = iter->second;
        }
        material = MixMaterial::Create(materialHandles, parameters, loc, alloc);
    } else
        ErrorExit(loc, "%s: material type unknown.", name);

    if (!material)
        ErrorExit(loc, "%s: unable to create material.", name);

    parameters.ReportUnused();
    ++nMaterialsCreated;
    return material;
}